

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O1

boolean compress_data(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  jpeg_c_coef_controller *pjVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  int iVar5;
  jpeg_c_coef_controller *pjVar6;
  jpeg_component_info *pjVar7;
  forward_DCT_ptr p_Var8;
  _func_boolean_j_compress_ptr_JSAMPIMAGE *p_Var9;
  boolean bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  JDIMENSION JVar18;
  long lVar19;
  
  pjVar6 = cinfo->coef;
  iVar12 = *(int *)&pjVar6[1].compress_data;
  if (iVar12 < *(int *)((long)&pjVar6[1].compress_data + 4)) {
    JVar2 = cinfo->total_iMCU_rows;
    uVar11 = cinfo->MCUs_per_row - 1;
    pjVar1 = pjVar6 + 2;
    do {
      for (uVar17 = *(uint *)((long)&pjVar6[1].start_pass + 4); uVar17 <= uVar11;
          uVar17 = uVar17 + 1) {
        if (0 < cinfo->comps_in_scan) {
          lVar14 = 0;
          iVar15 = 0;
          do {
            pjVar7 = cinfo->cur_comp_info[lVar14];
            if (0 < pjVar7->MCU_height) {
              p_Var8 = cinfo->fdct->forward_DCT[pjVar7->component_index];
              JVar3 = (&pjVar7->MCU_width)[(ulong)(uVar11 <= uVar17) * 4];
              iVar4 = pjVar7->MCU_sample_width;
              JVar18 = pjVar7->DCT_v_scaled_size * iVar12;
              iVar16 = 0;
              do {
                lVar19 = (long)iVar15;
                if ((*(uint *)&pjVar6[1].start_pass < JVar2 - 1) ||
                   (iVar12 + iVar16 < pjVar7->last_row_height)) {
                  (*p_Var8)(cinfo,pjVar7,input_buf[pjVar7->component_index],
                            (JBLOCKROW)(&pjVar6[2].start_pass)[lVar19],JVar18,iVar4 * uVar17,JVar3);
                  if ((int)JVar3 < pjVar7->MCU_width) {
                    memset((&pjVar6[2].start_pass)[(int)(iVar15 + JVar3)],0,
                           (long)(int)(pjVar7->MCU_width - JVar3) << 7);
                    iVar5 = pjVar7->MCU_width;
                    lVar13 = (long)(int)JVar3;
                    if ((int)JVar3 < iVar5) {
                      do {
                        (*(JBLOCKROW)(&pjVar1->start_pass)[lVar19 + lVar13])[0] =
                             **(JCOEF **)((long)pjVar1 + lVar13 * 8 + lVar19 * 8 + -8);
                        lVar13 = lVar13 + 1;
                      } while (iVar5 != lVar13);
                    }
                  }
                }
                else {
                  memset((&pjVar6[2].start_pass)[lVar19],0,(long)pjVar7->MCU_width << 7);
                  iVar5 = pjVar7->MCU_width;
                  if (0 < (long)iVar5) {
                    p_Var9 = (&pjVar6[1].compress_data)[lVar19];
                    lVar13 = 0;
                    do {
                      (*(JBLOCKROW)(&pjVar1->start_pass)[lVar19 + lVar13])[0] = *(JCOEF *)p_Var9;
                      lVar13 = lVar13 + 1;
                    } while (iVar5 != lVar13);
                  }
                }
                iVar15 = iVar15 + pjVar7->MCU_width;
                JVar18 = JVar18 + pjVar7->DCT_v_scaled_size;
                iVar16 = iVar16 + 1;
              } while (iVar16 < pjVar7->MCU_height);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < cinfo->comps_in_scan);
        }
        bVar10 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)pjVar1);
        if (bVar10 == 0) {
          *(int *)&pjVar6[1].compress_data = iVar12;
          *(uint *)((long)&pjVar6[1].start_pass + 4) = uVar17;
          return 0;
        }
      }
      *(undefined4 *)((long)&pjVar6[1].start_pass + 4) = 0;
      iVar12 = iVar12 + 1;
    } while (iVar12 < *(int *)((long)&pjVar6[1].compress_data + 4));
  }
  *(int *)&pjVar6[1].start_pass = *(int *)&pjVar6[1].start_pass + 1;
  start_iMCU_row(cinfo);
  return 1;
}

Assistant:

METHODDEF(boolean)
compress_data (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, bi, ci, yindex, yoffset, blockcnt;
  JDIMENSION ypos, xpos;
  jpeg_component_info *compptr;
  forward_DCT_ptr forward_DCT;

  /* Loop to write as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Determine where data comes from in input_buf and do the DCT thing.
       * Each call on forward_DCT processes a horizontal row of DCT blocks
       * as wide as an MCU; we rely on having allocated the MCU_buffer[] blocks
       * sequentially.  Dummy blocks at the right or bottom edge are filled in
       * specially.  The data in them does not matter for image reconstruction,
       * so we fill them with values that will encode to the smallest amount of
       * data, viz: all zeroes in the AC entries, DC entries equal to previous
       * block's DC value.  (Thanks to Thomas Kinsman for this idea.)
       */
      blkn = 0;
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	forward_DCT = cinfo->fdct->forward_DCT[compptr->component_index];
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	xpos = MCU_col_num * compptr->MCU_sample_width;
	ypos = yoffset * compptr->DCT_v_scaled_size;
	/* ypos == (yoffset+yindex) * DCTSIZE */
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    (*forward_DCT) (cinfo, compptr,
			    input_buf[compptr->component_index],
			    coef->MCU_buffer[blkn],
			    ypos, xpos, (JDIMENSION) blockcnt);
	    if (blockcnt < compptr->MCU_width) {
	      /* Create some dummy blocks at the right edge of the image. */
	      FMEMZERO((void FAR *) coef->MCU_buffer[blkn + blockcnt],
		       (compptr->MCU_width - blockcnt) * SIZEOF(JBLOCK));
	      for (bi = blockcnt; bi < compptr->MCU_width; bi++) {
		coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn+bi-1][0][0];
	      }
	    }
	  } else {
	    /* Create a row of dummy blocks at the bottom of the image. */
	    FMEMZERO((void FAR *) coef->MCU_buffer[blkn],
		     compptr->MCU_width * SIZEOF(JBLOCK));
	    for (bi = 0; bi < compptr->MCU_width; bi++) {
	      coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn-1][0][0];
	    }
	  }
	  blkn += compptr->MCU_width;
	  ypos += compptr->DCT_v_scaled_size;
	}
      }
      /* Try to write the MCU.  In event of a suspension failure, we will
       * re-DCT the MCU on restart (a bit inefficient, could be fixed...)
       */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}